

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.cpp
# Opt level: O0

void __thiscall
mnf::CartesianProduct::pseudoLog0_(CartesianProduct *this,RefVec *out,ConstRefVec *x)

{
  ulong uVar1;
  size_type sVar2;
  __shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  DenseBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
  local_f0 [56];
  ConstRefVec local_b8;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_90;
  DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
  local_78 [56];
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_40 [24];
  ulong local_28;
  size_t i;
  ConstRefVec *x_local;
  RefVec *out_local;
  CartesianProduct *this_local;
  
  local_28 = 0;
  i = (size_t)x;
  x_local = (ConstRefVec *)out;
  out_local = (RefVec *)this;
  while( true ) {
    uVar1 = local_28;
    sVar2 = std::
            vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
            ::size(&this->subManifolds_);
    if (sVar2 <= uVar1) break;
    this_00 = (__shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
              ::operator[](&this->subManifolds_,local_28);
    this_01 = std::
              __shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_00);
    Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::Ref
              (&local_90,out);
    Manifold::getView<1>((Segment *)local_78,&this->super_Manifold,&local_90,local_28);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (local_40,local_78,(type *)0x0);
    Manifold::getConstView<0>
              ((ConstSegment *)local_f0,&this->super_Manifold,(ConstRefVec *)i,local_28);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>const,_1,1,false>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_b8,
               local_f0,(type *)0x0);
    Manifold::pseudoLog0(this_01,(RefVec *)local_40,&local_b8);
    Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
              (&local_b8);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void CartesianProduct::pseudoLog0_(RefVec out, const ConstRefVec& x) const
{
  for (size_t i = 0; i < subManifolds_.size(); ++i)
  {
    subManifolds_[i]->pseudoLog0(getView<T>(out, i), getConstView<R>(x, i));
  }
}